

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O0

attribute * __thiscall MinVR::element::get_attribute(element *this,char *the_name)

{
  bool bVar1;
  int iVar2;
  reference ppaVar3;
  char *__s1;
  char *in_RSI;
  long in_RDI;
  list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> *in_stack_ffffffffffffffb8;
  _Self local_28;
  _List_node_base *local_20;
  char *local_18;
  
  local_18 = in_RSI;
  local_20 = (_List_node_base *)
             std::__cxx11::list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::begin
                       (in_stack_ffffffffffffffb8);
  *(_List_node_base **)(in_RDI + 0x18) = local_20;
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::end
                   (in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=((_Self *)(in_RDI + 0x18),&local_28);
    if (!bVar1) {
      return (attribute *)0x0;
    }
    ppaVar3 = std::_List_iterator<MinVR::attribute_*>::operator*
                        ((_List_iterator<MinVR::attribute_*> *)0x159b91);
    __s1 = attribute::get_name(*ppaVar3);
    iVar2 = strcmp(__s1,local_18);
    if (iVar2 == 0) break;
    std::_List_iterator<MinVR::attribute_*>::operator++
              ((_List_iterator<MinVR::attribute_*> *)(in_RDI + 0x18),0);
  }
  ppaVar3 = std::_List_iterator<MinVR::attribute_*>::operator*
                      ((_List_iterator<MinVR::attribute_*> *)0x159bb9);
  return *ppaVar3;
}

Assistant:

attribute* element::get_attribute(const char* the_name)
{
    it = m_attribute_list.begin();
    while(it != m_attribute_list.end())
    {
        if(strcmp((*it)->get_name(), the_name) == 0)
        {
            return ((attribute*) *it);
            break;
        }
        it++;
    }
    return NULL;
}